

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cartridge.hpp
# Opt level: O1

void __thiscall
Atari2600::Cartridge::Cartridge<Atari2600::Cartridge::Unpaged>::Cartridge
          (Cartridge<Atari2600::Cartridge::Unpaged> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *rom)

{
  pointer puVar1;
  pointer puVar2;
  
  Bus::Bus(&this->super_Bus);
  (this->super_Bus)._vptr_Bus = (_func_int **)&PTR__Cartridge_0059d678;
  CPU::MOS6502::ProcessorStorage::ProcessorStorage((ProcessorStorage *)&this->m6502_,P6502);
  (this->m6502_).bus_handler_ = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->rom_,rom);
  puVar1 = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (this->bus_extender_).super_BusExtender.rom_base_ =
       (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->bus_extender_).super_BusExtender.rom_size_ = (long)puVar1 - (long)puVar2;
  this->horizontal_counter_resets_ = 0;
  (this->cycle_count_).super_WrappedInt<Cycles>.length_ = 0;
  return;
}

Assistant:

Cartridge(const std::vector<uint8_t> &rom) :
			m6502_(*this),
			rom_(rom),
			bus_extender_(rom_.data(), rom.size()) {
			// The above works because bus_extender_ is declared after rom_ in the instance storage list;
			// consider doing something less fragile.
		}